

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *result_type,uint32_t argument
          )

{
  SPIRType *pSVar1;
  char (*in_R9) [2];
  string sStack_68;
  string op;
  
  pSVar1 = Compiler::expression_type(&this->super_Compiler,argument);
  (*(this->super_Compiler)._vptr_Compiler[0x3b])(&op,this,result_type,pSVar1);
  if (op._M_string_length == 0) {
    to_enclosed_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,argument,true);
  }
  else {
    to_unpacked_expression_abi_cxx11_(&sStack_68,this,argument,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
               (char (*) [2])&sStack_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,in_R9);
    ::std::__cxx11::string::~string((string *)&sStack_68);
  }
  ::std::__cxx11::string::~string((string *)&op);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl(const SPIRType &result_type, uint32_t argument)
{
	auto op = bitcast_glsl_op(result_type, expression_type(argument));
	if (op.empty())
		return to_enclosed_unpacked_expression(argument);
	else
		return join(op, "(", to_unpacked_expression(argument), ")");
}